

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BST.hpp
# Opt level: O2

void __thiscall
supermap::BST<supermap::Key<1ul>,unsigned_long,unsigned_long>::createLikeThis
          (BST<supermap::Key<1ul>,unsigned_long,unsigned_long> *this)

{
  BST<supermap::Key<1UL>,_unsigned_long,_unsigned_long>::createLikeThis
            ((BST<supermap::Key<1UL>,_unsigned_long,_unsigned_long> *)this);
  return;
}

Assistant:

std::unique_ptr<ExtractibleKeyValueStorage<Key, Value, IndexT>> createLikeThis() const override {
        return std::make_unique<BST<Key, Value, IndexT>>();
    }